

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

QFileSystemEntry * QFileSystemEngine::currentPath(void)

{
  char *pcVar1;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QFileSystemEntry *result;
  char currentName [4097];
  QFileSystemEntry *this;
  undefined7 in_stack_ffffffffffffef88;
  undefined1 uVar2;
  QFileSystemEntry *this_00;
  char local_1018 [4112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  this = in_RDI;
  this_00 = in_RDI;
  memset(in_RDI,0xaa,0x38);
  QFileSystemEntry::QFileSystemEntry(this);
  memset(local_1018,0xaa,0x1001);
  pcVar1 = getcwd(local_1018,0x1000);
  if (pcVar1 != (char *)0x0) {
    QByteArray::QByteArray
              ((QByteArray *)this_00,(char *)CONCAT17(uVar2,in_stack_ffffffffffffef88),
               (qsizetype)this);
    QFileSystemEntry::QFileSystemEntry
              ((QFileSystemEntry *)CONCAT17(uVar2,in_stack_ffffffffffffef88),(NativePath *)this,
               SUB81((ulong)this_00 >> 0x38,0));
    QFileSystemEntry::operator=(this,in_RDI);
    QFileSystemEntry::~QFileSystemEntry(this);
    QByteArray::~QByteArray((QByteArray *)0x16ca8c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QFileSystemEntry QFileSystemEngine::currentPath()
{
    QFileSystemEntry result;
#if defined(__GLIBC__) && !defined(PATH_MAX)
    char *currentName = ::get_current_dir_name();
    if (currentName) {
        result = QFileSystemEntry(QByteArray(currentName), QFileSystemEntry::FromNativePath());
        ::free(currentName);
    }
#else
    char currentName[PATH_MAX+1];
    if (::getcwd(currentName, PATH_MAX)) {
#if defined(Q_OS_VXWORKS) && defined(VXWORKS_VXSIM)
        QByteArray dir(currentName);
        if (dir.indexOf(':') < dir.indexOf('/'))
            dir.remove(0, dir.indexOf(':')+1);

        qstrncpy(currentName, dir.constData(), PATH_MAX);
#endif
        result = QFileSystemEntry(QByteArray(currentName), QFileSystemEntry::FromNativePath());
    }
# if defined(QT_DEBUG)
    if (result.isEmpty())
        qWarning("QFileSystemEngine::currentPath: getcwd() failed");
# endif
#endif
    return result;
}